

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

void Ssw_RarManInitialize(Ssw_RarMan_t *p,Vec_Int_t *vInit)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  word *pwVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  iVar2 = p->pAig->pConst1->Id;
  if (p->pAig->vObjs->nSize <= iVar2) {
LAB_006a4938:
    __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                  ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
  }
  iVar3 = p->pPars->nWords;
  if (0 < (long)iVar3) {
    memset(p->pObjData + iVar2 * iVar3,0xff,(long)iVar3 << 3);
  }
  Ssw_RarManAssingRandomPis(p);
  if (vInit == (Vec_Int_t *)0x0) {
    pAVar8 = p->pAig;
    iVar2 = pAVar8->nRegs;
    if (0 < (long)iVar2) {
      pVVar9 = pAVar8->vCos;
      iVar3 = pAVar8->nTruePos;
      lVar11 = 0;
      do {
        if ((((iVar3 < 0) || (lVar1 = lVar11 + iVar3, pVVar9->nSize <= lVar1)) ||
            (uVar12 = pAVar8->nTruePis + (int)lVar11, (int)uVar12 < 0)) ||
           (pAVar8->vCis->nSize <= (int)uVar12)) goto LAB_006a4919;
        iVar5 = *(int *)((long)pVVar9->pArray[lVar1] + 0x24);
        iVar6 = pAVar8->vObjs->nSize;
        if ((iVar6 <= iVar5) ||
           (iVar7 = *(int *)((long)pAVar8->vCis->pArray[uVar12] + 0x24), iVar6 <= iVar7))
        goto LAB_006a4938;
        uVar12 = p->pPars->nWords;
        if (0 < (int)uVar12) {
          pwVar10 = p->pObjData;
          uVar13 = 0;
          do {
            pwVar10[(long)(int)(iVar7 * uVar12) + uVar13] =
                 pwVar10[(long)(int)(iVar5 * uVar12) + uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar2);
    }
  }
  else {
    iVar2 = vInit->nSize;
    pAVar8 = p->pAig;
    uVar12 = pAVar8->nRegs;
    uVar4 = p->pPars->nWords;
    if (iVar2 != uVar4 * uVar12) {
      __assert_fail("Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x1ae,"void Ssw_RarManInitialize(Ssw_RarMan_t *, Vec_Int_t *)");
    }
    if (0 < (int)uVar12) {
      pVVar9 = pAVar8->vCis;
      iVar3 = pAVar8->nTruePis;
      uVar13 = 0;
      do {
        if ((iVar3 < 0) || (lVar11 = uVar13 + (long)iVar3, pVVar9->nSize <= lVar11)) {
LAB_006a4919:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar5 = *(int *)((long)pVVar9->pArray[lVar11] + 0x24);
        if (pAVar8->vObjs->nSize <= iVar5) goto LAB_006a4938;
        if (0 < (int)uVar4) {
          pwVar10 = p->pObjData;
          uVar14 = 0;
          uVar15 = uVar13;
          do {
            if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pwVar10[(long)(int)(iVar5 * uVar4) + uVar14] = -(ulong)(vInit->pArray[uVar15] != 0);
            uVar14 = uVar14 + 1;
            uVar15 = uVar15 + uVar12;
          } while (uVar4 != uVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
    }
  }
  return;
}

Assistant:

void Ssw_RarManInitialize( Ssw_RarMan_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj, * pObjLi;
    word * pSim, * pSimLi;
    int w, i;
    // constant
    pObj = Aig_ManConst1( p->pAig );
    pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    for ( w = 0; w < p->pPars->nWords; w++ )
        pSim[w] = ~(word)0;
    // primary inputs
    Ssw_RarManAssingRandomPis( p );
    // flop outputs
    if ( vInit )
    {
        assert( Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords );
        Saig_ManForEachLo( p->pAig, pObj, i )
        {
            pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = Vec_IntEntry(vInit, w * Saig_ManRegNum(p->pAig) + i) ? ~(word)0 : (word)0;
        }
    }
    else
    {
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
        {
            pSimLi = Ssw_RarObjSim( p, Aig_ObjId(pObjLi) );
            pSim   = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = pSimLi[w];
        }
    }
}